

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckh.c
# Opt level: O1

_Bool ckh_rebuild(ckh_t *ckh,ckhc_t *aTab)

{
  ulong uVar1;
  _Bool _Var2;
  void **ppvVar3;
  ulong uVar4;
  _Bool _Var5;
  void *data;
  void *key;
  void *local_40;
  void *local_38;
  
  uVar1 = ckh->count;
  ckh->count = 0;
  _Var5 = uVar1 != 0;
  if (_Var5) {
    ppvVar3 = &aTab->data;
    uVar4 = 0;
    do {
      local_38 = ((ckhc_t *)(ppvVar3 + -1))->key;
      if (local_38 != (void *)0x0) {
        local_40 = *ppvVar3;
        _Var2 = ckh_try_insert(ckh,&local_38,&local_40);
        if (_Var2) {
          ckh->count = uVar1;
          return _Var5;
        }
        uVar4 = uVar4 + 1;
      }
      ppvVar3 = ppvVar3 + 2;
      _Var5 = uVar4 < uVar1;
    } while (_Var5);
  }
  return _Var5;
}

Assistant:

static bool
ckh_rebuild(ckh_t *ckh, ckhc_t *aTab) {
	size_t count, i, nins;
	const void *key, *data;

	count = ckh->count;
	ckh->count = 0;
	for (i = nins = 0; nins < count; i++) {
		if (aTab[i].key != NULL) {
			key = aTab[i].key;
			data = aTab[i].data;
			if (ckh_try_insert(ckh, &key, &data)) {
				ckh->count = count;
				return true;
			}
			nins++;
		}
	}

	return false;
}